

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListHeader.cpp
# Opt level: O0

void __thiscall DestListHeader::printDestListHeader(DestListHeader *this)

{
  uint uVar1;
  ostream *poVar2;
  longlong lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  DestListHeader *local_10;
  DestListHeader *this_local;
  
  local_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "____________________DestListHeader______________________");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Version:                            ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,&this->Version);
  uVar1 = Utils::lenFourBytes(&local_28);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"1 - for Windows 7");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"    for Windows 8");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"3 - for Windows 10");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"4 - for Windows 10");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"TotalNumberOfCurrentEntries:        ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,&this->TotalNumberOfCurrentEntries);
  uVar1 = Utils::lenFourBytes(&local_50);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
  poVar2 = std::operator<<((ostream *)&std::cout,"TotalNumberOfPinnedEntries:         ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,&this->TotalNumberOfPinnedEntries);
  uVar1 = Utils::lenFourBytes(&local_68);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
  std::operator<<((ostream *)&std::cout,"Unknown:                            ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,&this->Unknown);
  Utils::print_vec(&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,"LastIssuedEntryId:                  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98,&this->LastIssuedEntryId);
  lVar3 = Utils::vectEightBytesToUnsignedInt(&local_98,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_98);
  poVar2 = std::operator<<((ostream *)&std::cout,"NumberOfAddedDeletedReopened:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,&this->NumberOfAddedDeletedReopened);
  lVar3 = Utils::vectEightBytesToUnsignedInt(&local_b0,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b0);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void DestListHeader::printDestListHeader() {
    cout << "____________________DestListHeader______________________" << endl;
    cout << "Version:                            " << dec<< Utils::lenFourBytes(Version) << endl;
        cout << Utils::defaultOffsetDocInfo << "1 - for Windows 7" << endl;
        cout << Utils::defaultOffsetDocInfo << "    for Windows 8" << endl;
        cout << Utils::defaultOffsetDocInfo << "3 - for Windows 10" << endl;
        cout << Utils::defaultOffsetDocInfo << "4 - for Windows 10" << endl;
    cout << "TotalNumberOfCurrentEntries:        " << dec<< Utils::lenFourBytes(TotalNumberOfCurrentEntries) << endl;
    cout << "TotalNumberOfPinnedEntries:         " << dec<< Utils::lenFourBytes(TotalNumberOfPinnedEntries) << endl;
    cout << "Unknown:                            "; Utils::print_vec(Unknown);
    cout << "LastIssuedEntryId:                  " << dec <<
         Utils::vectEightBytesToUnsignedInt(LastIssuedEntryId, 0) << endl;
    cout << "NumberOfAddedDeletedReopened:       " << dec <<
         Utils::vectEightBytesToUnsignedInt(NumberOfAddedDeletedReopened, 0) << endl;
    cout << "_________________________________________________________" << endl;
}